

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsScenesLoader15.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryKinematicsScenesLoader15::begin__instance_kinematics_model
          (LibraryKinematicsScenesLoader15 *this,
          instance_kinematics_model__AttributeData *attributeData)

{
  int iVar1;
  URI local_118;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  COLLADABU::URI::URI(&local_118);
  COLLADABU::URI::operator=(&local_118,&attributeData->url);
  local_30 = *(undefined4 *)&attributeData->sid;
  uStack_2c = *(undefined4 *)((long)&attributeData->sid + 4);
  uStack_28 = *(undefined4 *)&attributeData->name;
  uStack_24 = *(undefined4 *)((long)&attributeData->name + 4);
  iVar1 = (*(this->mLoader->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[0x13])();
  COLLADABU::URI::~URI(&local_118);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryKinematicsScenesLoader15::begin__instance_kinematics_model( const COLLADASaxFWL15::instance_kinematics_model__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_kinematics_model(attributeData));
COLLADASaxFWL::instance_kinematics_model__AttributeData attrData;
attrData.present_attributes = attributeData.present_attributes;
attrData.url = attributeData.url;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
return mLoader->begin__instance_kinematics_model(attrData);
}